

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

void slang::ast::addBuiltInMethods(Scope *scope,bool isCovergroup)

{
  Type *pTVar1;
  basic_string_view<char,_std::char_traits<char>_> funcName;
  MethodBuilder local_340;
  basic_string_view<char,_std::char_traits<char>_> local_2f0;
  MethodBuilder local_2e0;
  SVInt local_290;
  optional<slang::SVInt> local_280;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  SVInt local_258;
  optional<slang::SVInt> local_248;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  basic_string_view<char,_std::char_traits<char>_> local_220;
  undefined1 local_210 [8];
  MethodBuilder get_inst_coverage;
  optional<slang::SVInt> local_1b0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  SVInt local_188;
  optional<slang::SVInt> local_178;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  bitmask<slang::ast::MethodFlags> local_14a;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  undefined1 local_138 [8];
  MethodBuilder get_coverage;
  optional<slang::SVInt> local_d8;
  string_view local_c0;
  basic_string_view<char,_std::char_traits<char>_> local_b0;
  MethodBuilder local_a0;
  Type *local_50;
  Type *string_t;
  Type *real_t;
  Type *int_t;
  Type *void_t;
  anon_class_16_2_f7902cf0 makeFunc;
  Compilation *comp;
  bool isCovergroup_local;
  Scope *scope_local;
  
  void_t = (Type *)Scope::getCompilation(scope);
  makeFunc.comp = (Compilation *)scope;
  makeFunc.scope = (Scope *)void_t;
  int_t = Compilation::getVoidType((Compilation *)void_t);
  real_t = Compilation::getIntType((Compilation *)makeFunc.scope);
  string_t = Compilation::getRealType((Compilation *)makeFunc.scope);
  local_50 = Compilation::getStringType((Compilation *)makeFunc.scope);
  if (isCovergroup) {
    local_b0 = sv("set_inst_name",0xd);
    addBuiltInMethods::anon_class_16_2_f7902cf0::operator()
              (&local_a0,(anon_class_16_2_f7902cf0 *)&void_t,local_b0,int_t);
    local_c0 = sv("name",4);
    pTVar1 = local_50;
    std::optional<slang::SVInt>::optional(&local_d8);
    MethodBuilder::addArg(&local_a0,local_c0,pTVar1,In,&local_d8);
    std::optional<slang::SVInt>::~optional(&local_d8);
    MethodBuilder::~MethodBuilder(&local_a0);
  }
  local_148 = sv("get_coverage",0xc);
  addBuiltInMethods::anon_class_16_2_f7902cf0::operator()
            ((MethodBuilder *)local_138,(anon_class_16_2_f7902cf0 *)&void_t,local_148,string_t);
  bitmask<slang::ast::MethodFlags>::bitmask(&local_14a,Static);
  MethodBuilder::addFlags((MethodBuilder *)local_138,local_14a);
  local_160 = sv("covered_bins",0xc);
  pTVar1 = real_t;
  SVInt::SVInt(&local_188,0x20,0,true);
  std::optional<slang::SVInt>::optional<slang::SVInt,_true>(&local_178,&local_188);
  MethodBuilder::addArg((MethodBuilder *)local_138,local_160,pTVar1,Ref,&local_178);
  std::optional<slang::SVInt>::~optional(&local_178);
  SVInt::~SVInt(&local_188);
  local_198 = sv("total_bins",10);
  pTVar1 = real_t;
  SVInt::SVInt((SVInt *)(get_inst_coverage.args.stackBase + 0x18),0x20,0,true);
  std::optional<slang::SVInt>::optional<slang::SVInt,_true>
            (&local_1b0,(SVInt *)(get_inst_coverage.args.stackBase + 0x18));
  MethodBuilder::addArg((MethodBuilder *)local_138,local_198,pTVar1,Ref,&local_1b0);
  std::optional<slang::SVInt>::~optional(&local_1b0);
  SVInt::~SVInt((SVInt *)(get_inst_coverage.args.stackBase + 0x18));
  local_220 = sv("get_inst_coverage",0x11);
  addBuiltInMethods::anon_class_16_2_f7902cf0::operator()
            ((MethodBuilder *)local_210,(anon_class_16_2_f7902cf0 *)&void_t,local_220,string_t);
  local_230 = sv("covered_bins",0xc);
  pTVar1 = real_t;
  SVInt::SVInt(&local_258,0x20,0,true);
  std::optional<slang::SVInt>::optional<slang::SVInt,_true>(&local_248,&local_258);
  MethodBuilder::addArg((MethodBuilder *)local_210,local_230,pTVar1,Ref,&local_248);
  std::optional<slang::SVInt>::~optional(&local_248);
  SVInt::~SVInt(&local_258);
  local_268 = sv("total_bins",10);
  pTVar1 = real_t;
  SVInt::SVInt(&local_290,0x20,0,true);
  std::optional<slang::SVInt>::optional<slang::SVInt,_true>(&local_280,&local_290);
  MethodBuilder::addArg((MethodBuilder *)local_210,local_268,pTVar1,Ref,&local_280);
  std::optional<slang::SVInt>::~optional(&local_280);
  SVInt::~SVInt(&local_290);
  local_2f0 = sv("start",5);
  addBuiltInMethods::anon_class_16_2_f7902cf0::operator()
            (&local_2e0,(anon_class_16_2_f7902cf0 *)&void_t,local_2f0,int_t);
  MethodBuilder::~MethodBuilder(&local_2e0);
  funcName = sv("stop",4);
  addBuiltInMethods::anon_class_16_2_f7902cf0::operator()
            (&local_340,(anon_class_16_2_f7902cf0 *)&void_t,funcName,int_t);
  MethodBuilder::~MethodBuilder(&local_340);
  MethodBuilder::~MethodBuilder((MethodBuilder *)local_210);
  MethodBuilder::~MethodBuilder((MethodBuilder *)local_138);
  return;
}

Assistant:

static void addBuiltInMethods(Scope& scope, bool isCovergroup) {
    auto& comp = scope.getCompilation();
    auto makeFunc = [&](string_view funcName, const Type& returnType) {
        MethodBuilder builder(comp, funcName, returnType, SubroutineKind::Function);
        scope.addMember(builder.symbol);
        return builder;
    };

    auto& void_t = comp.getVoidType();
    auto& int_t = comp.getIntType();
    auto& real_t = comp.getRealType();
    auto& string_t = comp.getStringType();

    if (isCovergroup)
        makeFunc("set_inst_name"sv, void_t).addArg("name"sv, string_t);

    auto get_coverage = makeFunc("get_coverage"sv, real_t);
    get_coverage.addFlags(MethodFlags::Static);
    get_coverage.addArg("covered_bins"sv, int_t, ArgumentDirection::Ref, SVInt(32, 0, true));
    get_coverage.addArg("total_bins"sv, int_t, ArgumentDirection::Ref, SVInt(32, 0, true));

    auto get_inst_coverage = makeFunc("get_inst_coverage"sv, real_t);
    get_inst_coverage.addArg("covered_bins"sv, int_t, ArgumentDirection::Ref, SVInt(32, 0, true));
    get_inst_coverage.addArg("total_bins"sv, int_t, ArgumentDirection::Ref, SVInt(32, 0, true));

    makeFunc("start"sv, void_t);
    makeFunc("stop"sv, void_t);
}